

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O0

UChar * uenum_unext_63(UEnumeration *en,int32_t *resultLength,UErrorCode *status)

{
  UBool UVar1;
  UChar *pUVar2;
  UErrorCode *status_local;
  int32_t *resultLength_local;
  UEnumeration *en_local;
  
  if ((en != (UEnumeration *)0x0) && (UVar1 = U_FAILURE(*status), UVar1 == '\0')) {
    if (en->uNext != (UEnumUNext *)0x0) {
      pUVar2 = (*en->uNext)(en,resultLength,status);
      return pUVar2;
    }
    *status = U_UNSUPPORTED_ERROR;
    return (UChar *)0x0;
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI const UChar* U_EXPORT2
uenum_unext(UEnumeration* en,
            int32_t* resultLength,
            UErrorCode* status)
{
    if (!en || U_FAILURE(*status)) {
        return NULL;
    }
    if (en->uNext != NULL) {
        return en->uNext(en, resultLength, status);
    } else {
        *status = U_UNSUPPORTED_ERROR;
        return NULL;
    }
}